

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

void __thiscall features::Surf::extrema_detection(Surf *this)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  ImageBase *pIVar6;
  reference __r;
  element_type *this_00;
  int local_54;
  int local_50;
  int x;
  int y;
  float *local_40;
  RespType *ptr;
  ConstPtr ss;
  size_t s;
  int height;
  int width;
  size_t o;
  Surf *this_local;
  
  _height = 0;
  while( true ) {
    sVar3 = std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::size
                      (&this->octaves);
    if (sVar3 <= _height) break;
    pvVar4 = std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::
             operator[](&this->octaves,_height);
    p_Var5 = (__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
             ::operator[](&pvVar4->imgs,0);
    pIVar6 = (ImageBase *)
             std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var5);
    iVar1 = core::ImageBase::width(pIVar6);
    pvVar4 = std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::
             operator[](&this->octaves,_height);
    p_Var5 = (__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
             ::operator[](&pvVar4->imgs,0);
    pIVar6 = (ImageBase *)
             std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var5);
    iVar2 = core::ImageBase::height(pIVar6);
    for (ss.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        ss.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
        ss.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&(ss.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
      pvVar4 = std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::
               operator[](&this->octaves,_height);
      __r = std::
            vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
            ::operator[](&pvVar4->imgs,
                         (size_type)
                         ss.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
      std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
                ((shared_ptr<core::Image<float>const> *)&ptr,__r);
      this_00 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ptr);
      local_40 = core::Image<float>::at(this_00,0);
      for (local_50 = 0; local_50 < iVar2; local_50 = local_50 + 1) {
        for (local_54 = 1; local_54 + 1 < iVar1; local_54 = local_54 + 1) {
          if ((local_40[local_54 + -1] <= local_40[local_54] &&
               local_40[local_54] != local_40[local_54 + -1]) &&
             (local_40[local_54 + 1] <= local_40[local_54] &&
              local_40[local_54] != local_40[local_54 + 1])) {
            check_maximum(this,height,
                          (int)ss.
                               super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi,local_54,local_50);
          }
        }
        local_40 = local_40 + iVar1;
      }
      std::shared_ptr<const_core::Image<float>_>::~shared_ptr
                ((shared_ptr<const_core::Image<float>_> *)&ptr);
    }
    _height = _height + 1;
  }
  return;
}

Assistant:

void
Surf::extrema_detection (void)
{
    /*
     * At this stage each octave contains 4 scale space samples and local
     * maxima/minima in the approximated DoG function need to be found.
     * To this end, a simple non-maximum suppression technique is applied.
     */
    for (std::size_t o = 0; o < this->octaves.size(); ++o)
    {
        int const width = this->octaves[o].imgs[0]->width();
        int const height = this->octaves[o].imgs[0]->height();
        for (std::size_t s = 1; s < 3; ++s)
        {
            Octave::RespImage::ConstPtr ss = this->octaves[o].imgs[s];
            Octave::RespType const* ptr = &ss->at(0);
            for (int y = 0; y < height; ++y, ptr += width)
                for (int x = 1; x + 1 < width; ++x)
                    if (ptr[x] > ptr[x-1] && ptr[x] > ptr[x + 1])
                        this->check_maximum(o, s, x, y);
        }
    }
}